

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O2

int ARKodeSetFixedStepBounds(void *arkode_mem,sunrealtype lb,sunrealtype ub)

{
  int iVar1;
  ARKodeMem ark_mem;
  ARKodeHAdaptMem hadapt_mem;
  
  iVar1 = arkAccessHAdaptMem(arkode_mem,"ARKodeSetFixedStepBounds",&ark_mem,&hadapt_mem);
  if (iVar1 == 0) {
    if (ark_mem->step_supports_adaptive == 0) {
      iVar1 = -0x30;
      arkProcessError(ark_mem,-0x30,0x6ce,"ARKodeSetFixedStepBounds",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                      ,"time-stepping module does not support temporal adaptivity");
    }
    else {
      if ((1.0 < lb) || (ub < 1.0)) {
        hadapt_mem->lbound = 1.0;
        hadapt_mem->ubound = 1.5;
      }
      else {
        hadapt_mem->lbound = lb;
        hadapt_mem->ubound = ub;
      }
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int ARKodeSetFixedStepBounds(void* arkode_mem, sunrealtype lb, sunrealtype ub)
{
  int retval;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  retval = arkAccessHAdaptMem(arkode_mem, __func__, &ark_mem, &hadapt_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Guard against use for non-adaptive time stepper modules */
  if (!ark_mem->step_supports_adaptive)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support temporal adaptivity");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* set allowable interval, otherwise set defaults */
  if ((lb <= ONE) && (ub >= ONE))
  {
    hadapt_mem->lbound = lb;
    hadapt_mem->ubound = ub;
  }
  else
  {
    hadapt_mem->lbound = HFIXED_LB;
    hadapt_mem->ubound = HFIXED_UB;
  }

  return (ARK_SUCCESS);
}